

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  stbi_uc *psVar7;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  stbi_uc *psVar15;
  char *pcVar16;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  byte bVar22;
  int iVar23;
  long lVar24;
  stbi_uc *__dest;
  long lVar25;
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  byte *pbVar30;
  int iVar31;
  uint uVar32;
  byte *pbVar33;
  long lVar34;
  long in_FS_OFFSET;
  bool bVar35;
  ulong local_80;
  ulong uVar8;
  
  bVar35 = depth == 0x10;
  uVar2 = x * out_n;
  uVar3 = uVar2 << bVar35;
  a_00 = a->s->img_n;
  lVar34 = (long)a_00;
  psVar7 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar35,0);
  a->out = psVar7;
  if (psVar7 == (stbi_uc *)0x0) {
    pcVar16 = "Out of memory";
  }
  else {
    iVar4 = stbi__mad3sizes_valid(a_00,x,depth,7);
    pcVar16 = "Corrupt PNG";
    if (iVar4 != 0) {
      uVar12 = a_00 * x;
      uVar5 = uVar12 * depth + 7 >> 3;
      uVar8 = (ulong)uVar5;
      if ((uVar5 + 1) * y <= raw_len) {
        if (y == 0) {
joined_r0x0015ecdc:
          if (depth != 0x10) {
            return 1;
          }
LAB_0015ecde:
          if (uVar2 * y == 0) {
            return 1;
          }
          psVar7 = a->out;
          lVar34 = 0;
          do {
            puVar1 = (ushort *)(psVar7 + lVar34 * 2);
            *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
            lVar34 = lVar34 + 1;
          } while (uVar2 * y != (int)lVar34);
          return 1;
        }
        uVar21 = 0;
        if (depth < 8) {
          uVar21 = (ulong)(uVar2 - uVar5);
        }
        bVar22 = *raw;
        if (bVar22 < 5) {
          uVar13 = (ulong)uVar3;
          lVar29 = (long)(out_n << bVar35);
          iVar4 = x - 1;
          uVar9 = (ulong)y;
          psVar7 = a->out;
          lVar10 = -lVar29;
          uVar17 = 0;
          lVar14 = 0;
          uVar5 = a_00 << bVar35;
          local_80 = (ulong)x;
          do {
            uVar27 = uVar5;
            if (depth < 8) {
              local_80 = uVar8;
              uVar27 = 1;
            }
            if (lVar14 == 0) {
              bVar22 = ""[bVar22];
            }
            lVar24 = uVar21 - uVar13;
            if (0 < (int)uVar27) {
              uVar28 = 0;
              do {
                switch(bVar22) {
                case 0:
                case 1:
                case 5:
                case 6:
                  bVar18 = raw[uVar28 + 1];
                  goto LAB_0015e6c2;
                case 2:
                case 4:
                  bVar18 = psVar7[uVar28 + lVar24];
                  break;
                case 3:
                  bVar18 = psVar7[uVar28 + lVar24] >> 1;
                  break;
                default:
                  goto switchD_0015e6aa_default;
                }
                bVar18 = bVar18 + raw[uVar28 + 1];
LAB_0015e6c2:
                psVar7[uVar28 + uVar21] = bVar18;
switchD_0015e6aa_default:
                uVar28 = uVar28 + 1;
              } while (uVar27 != uVar28);
            }
            if (depth == 8) {
              lVar25 = (long)out_n;
              lVar11 = lVar34;
              if (a_00 != out_n) {
                psVar7[lVar34] = 0xff;
              }
LAB_0015e71a:
              raw = raw + lVar11 + 1;
              lVar11 = lVar25;
            }
            else {
              if (depth == 0x10) {
                lVar11 = (long)(int)uVar5;
                lVar25 = lVar29;
                if (a_00 != out_n) {
                  (psVar7 + lVar11)[0] = 0xff;
                  (psVar7 + lVar11)[1] = 0xff;
                }
                goto LAB_0015e71a;
              }
              raw = raw + 2;
              lVar11 = uVar21 + 1;
              lVar25 = 1;
            }
            __dest = psVar7 + lVar11;
            psVar15 = psVar7 + lVar25 + lVar24;
            if (depth < 8 || a_00 == out_n) {
              uVar5 = ((int)local_80 + -1) * uVar27;
              switch(bVar22) {
              case 0:
                memcpy(__dest,raw,(long)(int)uVar5);
                break;
              case 1:
                if (0 < (int)uVar5) {
                  uVar17 = 0;
                  do {
                    __dest[uVar17] = __dest[uVar17 - (long)(int)uVar27] + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar5 != uVar17);
                }
                break;
              case 2:
                if (0 < (int)uVar5) {
                  uVar17 = 0;
                  do {
                    __dest[uVar17] = psVar15[uVar17] + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar5 != uVar17);
                }
                break;
              case 3:
                if (0 < (int)uVar5) {
                  uVar17 = 0;
                  do {
                    __dest[uVar17] =
                         (char)((uint)__dest[uVar17 - (long)(int)uVar27] + (uint)psVar15[uVar17] >>
                               1) + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar5 != uVar17);
                }
                break;
              case 4:
                if (0 < (int)uVar5) {
                  uVar17 = 0;
                  do {
                    bVar22 = __dest[uVar17 - (long)(int)uVar27];
                    bVar18 = psVar15[uVar17];
                    bVar26 = psVar7[uVar17 + (lVar25 - (int)uVar27) + (uVar21 - uVar13)];
                    iVar31 = ((uint)bVar18 + (uint)bVar22) - (uint)bVar26;
                    uVar19 = iVar31 - (uint)bVar22;
                    uVar6 = -uVar19;
                    if (0 < (int)uVar19) {
                      uVar6 = uVar19;
                    }
                    uVar20 = iVar31 - (uint)bVar18;
                    uVar19 = -uVar20;
                    if (0 < (int)uVar20) {
                      uVar19 = uVar20;
                    }
                    uVar32 = iVar31 - (uint)bVar26;
                    uVar20 = -uVar32;
                    if (0 < (int)uVar32) {
                      uVar20 = uVar32;
                    }
                    if (uVar19 <= uVar20) {
                      bVar26 = bVar18;
                    }
                    if (uVar20 < uVar6) {
                      bVar22 = bVar26;
                    }
                    if (uVar19 < uVar6) {
                      bVar22 = bVar26;
                    }
                    __dest[uVar17] = bVar22 + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar5 != uVar17);
                }
                break;
              case 5:
                if (0 < (int)uVar5) {
                  uVar17 = 0;
                  do {
                    __dest[uVar17] = (__dest[uVar17 - (long)(int)uVar27] >> 1) + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar5 != uVar17);
                }
                break;
              case 6:
                if (0 < (int)uVar5) {
                  uVar17 = 0;
                  do {
                    __dest[uVar17] = __dest[uVar17 - (long)(int)uVar27] + raw[uVar17];
                    uVar17 = uVar17 + 1;
                  } while (uVar5 != uVar17);
                }
              }
              raw = raw + (int)uVar5;
LAB_0015ec51:
              if (lVar14 + 1U == uVar9) {
                if (depth < 8) {
                  if (y == 0) {
                    return 1;
                  }
                  uVar5 = x - 1;
                  lVar34 = uVar2 - uVar8;
                  lVar10 = (ulong)uVar5 + 1;
                  uVar27 = 0;
                  uVar21 = 0;
                  do {
                    bVar22 = 1;
                    if (color == 0) {
                      bVar22 = ""[depth];
                    }
                    psVar7 = a->out;
                    pbVar30 = psVar7 + uVar3 * (int)uVar21;
                    pbVar33 = pbVar30 + (uVar2 - uVar8);
                    uVar13 = (ulong)uVar27;
                    if (depth == 4) {
                      uVar6 = uVar12;
                      if (1 < (int)uVar12) {
                        psVar15 = psVar7 + lVar34;
                        uVar19 = uVar12;
                        do {
                          psVar7[uVar13] = (psVar15[uVar13] >> 4) * bVar22;
                          psVar7[uVar13 + 1] = (psVar15[uVar13] & 0xf) * bVar22;
                          uVar6 = uVar19 - 2;
                          psVar15 = psVar15 + 1;
                          psVar7 = psVar7 + 2;
                          bVar35 = 3 < uVar19;
                          uVar19 = uVar6;
                        } while (bVar35);
                        pbVar33 = psVar15 + uVar13;
                        pbVar30 = psVar7 + uVar13;
                      }
                      if (uVar6 == 1) {
                        *pbVar30 = (*pbVar33 >> 4) * bVar22;
                      }
                    }
                    else if (depth == 2) {
                      uVar6 = uVar12;
                      if (3 < (int)uVar12) {
                        psVar15 = psVar7 + lVar34;
                        uVar19 = uVar12;
                        do {
                          psVar7[uVar13] = (psVar15[uVar13] >> 6) * bVar22;
                          psVar7[uVar13 + 1] = (psVar15[uVar13] >> 4 & 3) * bVar22;
                          psVar7[uVar13 + 2] = (psVar15[uVar13] >> 2 & 3) * bVar22;
                          psVar7[uVar13 + 3] = (psVar15[uVar13] & 3) * bVar22;
                          uVar6 = uVar19 - 4;
                          psVar15 = psVar15 + 1;
                          psVar7 = psVar7 + 4;
                          bVar35 = 7 < uVar19;
                          uVar19 = uVar6;
                        } while (bVar35);
                        pbVar33 = psVar15 + uVar13;
                        pbVar30 = psVar7 + uVar13;
                      }
                      if (((0 < (int)uVar6) && (*pbVar30 = (*pbVar33 >> 6) * bVar22, uVar6 != 1)) &&
                         (pbVar30[1] = (*pbVar33 >> 4 & 3) * bVar22, uVar6 == 3)) {
                        pbVar30[2] = (*pbVar33 >> 2 & 3) * bVar22;
                      }
                    }
                    else if (depth == 1) {
                      uVar6 = uVar12;
                      if (7 < (int)uVar12) {
                        psVar15 = psVar7 + lVar34;
                        uVar19 = uVar12;
                        do {
                          psVar7[uVar13] = (char)psVar15[uVar13] >> 7 & bVar22;
                          psVar7[uVar13 + 1] = (char)(psVar15[uVar13] * '\x02') >> 7 & bVar22;
                          psVar7[uVar13 + 2] = (char)(psVar15[uVar13] << 2) >> 7 & bVar22;
                          psVar7[uVar13 + 3] = (char)(psVar15[uVar13] << 3) >> 7 & bVar22;
                          psVar7[uVar13 + 4] = (char)(psVar15[uVar13] << 4) >> 7 & bVar22;
                          psVar7[uVar13 + 5] = (char)(psVar15[uVar13] << 5) >> 7 & bVar22;
                          psVar7[uVar13 + 6] = (char)(psVar15[uVar13] << 6) >> 7 & bVar22;
                          bVar18 = bVar22;
                          if ((psVar15[uVar13] & 1) == 0) {
                            bVar18 = 0;
                          }
                          psVar7[uVar13 + 7] = bVar18;
                          uVar6 = uVar19 - 8;
                          psVar15 = psVar15 + 1;
                          psVar7 = psVar7 + 8;
                          bVar35 = 0xf < uVar19;
                          uVar19 = uVar6;
                        } while (bVar35);
                        pbVar33 = psVar15 + uVar13;
                        pbVar30 = psVar7 + uVar13;
                      }
                      if (((((0 < (int)uVar6) &&
                            (*pbVar30 = (char)*pbVar33 >> 7 & bVar22, uVar6 != 1)) &&
                           ((pbVar30[1] = (char)(*pbVar33 * '\x02') >> 7 & bVar22, 2 < uVar6 &&
                            ((pbVar30[2] = (char)(*pbVar33 << 2) >> 7 & bVar22, uVar6 != 3 &&
                             (pbVar30[3] = (char)(*pbVar33 << 3) >> 7 & bVar22, 4 < uVar6)))))) &&
                          (pbVar30[4] = (char)(*pbVar33 << 4) >> 7 & bVar22, uVar6 != 5)) &&
                         (pbVar30[5] = (char)(*pbVar33 << 5) >> 7 & bVar22, uVar6 == 7)) {
                        pbVar30[6] = (char)(*pbVar33 << 6) >> 7 & bVar22;
                      }
                    }
                    if (a_00 != out_n) {
                      psVar7 = a->out;
                      if (a_00 == 1) {
                        lVar14 = lVar10;
                        if (-1 < (int)uVar5) {
                          do {
                            psVar7[lVar14 * 2 + (uVar13 - 1)] = 0xff;
                            psVar7[lVar14 * 2 + (uVar13 - 2)] = psVar7[lVar14 + (uVar13 - 1)];
                            lVar29 = lVar14 + -1;
                            bVar35 = 0 < lVar14;
                            lVar14 = lVar29;
                          } while (lVar29 != 0 && bVar35);
                        }
                      }
                      else if (-1 < (int)uVar5) {
                        psVar15 = psVar7 + (ulong)uVar5 * 3 + 2 + uVar13;
                        lVar14 = lVar10;
                        do {
                          psVar7[lVar14 * 4 + (uVar13 - 1)] = 0xff;
                          psVar7[lVar14 * 4 + (uVar13 - 2)] = *psVar15;
                          psVar7[lVar14 * 4 + (uVar13 - 3)] = psVar15[-1];
                          psVar7[lVar14 * 4 + (uVar13 - 4)] = psVar15[-2];
                          psVar15 = psVar15 + -3;
                          lVar29 = lVar14 + -1;
                          bVar35 = 0 < lVar14;
                          lVar14 = lVar29;
                        } while (lVar29 != 0 && bVar35);
                      }
                    }
                    uVar21 = uVar21 + 1;
                    uVar27 = uVar27 + uVar3;
                  } while (uVar21 != uVar9);
                  return 1;
                }
                goto joined_r0x0015ecdc;
              }
            }
            else {
              switch(bVar22) {
              case 0:
                if (iVar4 != 0) {
                  iVar31 = iVar4;
                  do {
                    if (0 < (int)uVar27) {
                      uVar28 = 0;
                      do {
                        __dest[uVar28] = raw[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar27 != uVar28);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar29;
                    iVar31 = iVar31 + -1;
                  } while (iVar31 != 0);
                }
                break;
              case 1:
                if (iVar4 != 0) {
                  lVar24 = (long)__dest + lVar10;
                  iVar31 = iVar4;
                  do {
                    if (0 < (int)uVar27) {
                      uVar28 = 0;
                      do {
                        __dest[uVar28] = *(char *)(lVar24 + uVar28) + raw[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar27 != uVar28);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar29;
                    lVar24 = lVar24 + lVar29;
                    iVar31 = iVar31 + -1;
                  } while (iVar31 != 0);
                }
                break;
              case 2:
                if (iVar4 != 0) {
                  iVar31 = iVar4;
                  do {
                    if (0 < (int)uVar27) {
                      uVar28 = 0;
                      do {
                        __dest[uVar28] = psVar15[uVar28] + raw[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar27 != uVar28);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar29;
                    psVar15 = psVar15 + lVar29;
                    iVar31 = iVar31 + -1;
                  } while (iVar31 != 0);
                }
                break;
              case 3:
                if (iVar4 != 0) {
                  lVar24 = (long)__dest + lVar10;
                  iVar31 = iVar4;
                  do {
                    if (0 < (int)uVar27) {
                      uVar28 = 0;
                      do {
                        __dest[uVar28] =
                             (char)((uint)*(byte *)(lVar24 + uVar28) + (uint)psVar15[uVar28] >> 1) +
                             raw[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar27 != uVar28);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar29;
                    psVar15 = psVar15 + lVar29;
                    lVar24 = lVar24 + lVar29;
                    iVar31 = iVar31 + -1;
                  } while (iVar31 != 0);
                }
                break;
              case 4:
                if (iVar4 != 0) {
                  lVar24 = (long)__dest + lVar10;
                  psVar7 = psVar7 + lVar25 + ((uVar21 - lVar29) - uVar13);
                  iVar31 = iVar4;
                  do {
                    if (0 < (int)uVar27) {
                      uVar28 = 0;
                      do {
                        bVar22 = *(byte *)(lVar24 + uVar28);
                        bVar18 = psVar15[uVar28];
                        bVar26 = psVar7[uVar28];
                        iVar23 = ((uint)bVar18 + (uint)bVar22) - (uint)bVar26;
                        uVar19 = iVar23 - (uint)bVar22;
                        uVar6 = -uVar19;
                        if (0 < (int)uVar19) {
                          uVar6 = uVar19;
                        }
                        uVar20 = iVar23 - (uint)bVar18;
                        uVar19 = -uVar20;
                        if (0 < (int)uVar20) {
                          uVar19 = uVar20;
                        }
                        uVar32 = iVar23 - (uint)bVar26;
                        uVar20 = -uVar32;
                        if (0 < (int)uVar32) {
                          uVar20 = uVar32;
                        }
                        if (uVar19 <= uVar20) {
                          bVar26 = bVar18;
                        }
                        if (uVar20 < uVar6) {
                          bVar22 = bVar26;
                        }
                        if (uVar19 < uVar6) {
                          bVar22 = bVar26;
                        }
                        __dest[uVar28] = bVar22 + raw[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar27 != uVar28);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar29;
                    psVar15 = psVar15 + lVar29;
                    lVar24 = lVar24 + lVar29;
                    psVar7 = psVar7 + lVar29;
                    iVar31 = iVar31 + -1;
                  } while (iVar31 != 0);
                }
                break;
              case 5:
                if (iVar4 != 0) {
                  lVar24 = (long)__dest + lVar10;
                  iVar31 = iVar4;
                  do {
                    if (0 < (int)uVar27) {
                      uVar28 = 0;
                      do {
                        __dest[uVar28] = (*(byte *)(lVar24 + uVar28) >> 1) + raw[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar27 != uVar28);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar29;
                    lVar24 = lVar24 + lVar29;
                    iVar31 = iVar31 + -1;
                  } while (iVar31 != 0);
                }
                break;
              case 6:
                if (iVar4 != 0) {
                  lVar24 = (long)__dest + lVar10;
                  iVar31 = iVar4;
                  do {
                    if (0 < (int)uVar27) {
                      uVar28 = 0;
                      do {
                        __dest[uVar28] = *(char *)(lVar24 + uVar28) + raw[uVar28];
                        uVar28 = uVar28 + 1;
                      } while (uVar27 != uVar28);
                    }
                    __dest[(int)uVar5] = 0xff;
                    raw = raw + (int)uVar5;
                    __dest = __dest + lVar29;
                    lVar24 = lVar24 + lVar29;
                    iVar31 = iVar31 + -1;
                  } while (iVar31 != 0);
                }
              }
              if (depth != 0x10) goto LAB_0015ec51;
              if (x != 0) {
                psVar7 = a->out + (long)(int)uVar5 + uVar17 + 1;
                uVar17 = (ulong)x;
                do {
                  *psVar7 = 0xff;
                  psVar7 = psVar7 + lVar29;
                  uVar5 = (int)uVar17 - 1;
                  uVar17 = (ulong)uVar5;
                } while (uVar5 != 0);
                goto LAB_0015ec51;
              }
              if (lVar14 + 1U == uVar9) goto LAB_0015ecde;
            }
            lVar14 = lVar14 + 1;
            uVar17 = (ulong)(uVar3 * (int)lVar14);
            psVar7 = a->out + uVar17;
            bVar22 = *raw;
            uVar5 = uVar27;
          } while (bVar22 < 5);
        }
        pcVar16 = "Corrupt PNG";
      }
    }
  }
  *(char **)(in_FS_OFFSET + -0x10) = pcVar16;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }